

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O0

Status __thiscall
flatbuffers::anon_unknown_0::FBSCodeGenerator::GenerateCodeString
          (FBSCodeGenerator *this,Parser *parser,string *filename,string *output)

{
  string local_48;
  string *local_28;
  string *output_local;
  string *filename_local;
  Parser *parser_local;
  FBSCodeGenerator *this_local;
  
  local_28 = output;
  output_local = filename;
  filename_local = (string *)parser;
  parser_local = (Parser *)this;
  GenerateFBS(&local_48,parser,filename,(bool)(this->no_log_ & 1));
  std::__cxx11::string::operator=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return OK;
}

Assistant:

Status GenerateCodeString(const Parser &parser, const std::string &filename,
                            std::string &output) override {
    output = GenerateFBS(parser, filename, no_log_);
    return Status::OK;
  }